

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

Mat * ncnn::Mat::from_float16(Mat *__return_storage_ptr__,unsigned_short *data,int size)

{
  int *piVar1;
  ushort uVar2;
  bool bVar3;
  void *pvVar4;
  uint *puVar5;
  uint uVar6;
  void *pvVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  
  __return_storage_ptr__->elemsize = 0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->elemsize = 4;
  __return_storage_ptr__->dims = 1;
  __return_storage_ptr__->w = size;
  __return_storage_ptr__->h = 1;
  __return_storage_ptr__->c = 1;
  sVar11 = (size_t)size;
  __return_storage_ptr__->cstep = sVar11;
  if (size != 0) {
    pvVar4 = malloc(sVar11 * 4 + 0x1c);
    pvVar7 = (void *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar7 - 8) = pvVar4;
    __return_storage_ptr__->data = pvVar7;
    piVar1 = (int *)((long)pvVar7 + sVar11 * 4);
    __return_storage_ptr__->refcount = piVar1;
    *piVar1 = 1;
  }
  puVar5 = (uint *)__return_storage_ptr__->data;
  if (0 < size && puVar5 != (uint *)0x0) {
    do {
      uVar2 = *data;
      uVar6 = (uint)(uVar2 >> 0xf);
      uVar10 = uVar2 >> 10 & 0x1f;
      if (uVar10 == 0x1f) {
        uVar6 = (uint)uVar2 << 0xd | uVar6 << 0x1f | 0x7f800000;
      }
      else {
        uVar8 = uVar2 & 0x3ff;
        if ((uVar2 >> 10 & 0x1f) == 0) {
          if ((short)uVar8 == 0) {
            uVar6 = uVar6 << 0x1f;
          }
          else {
            uVar10 = 0x38000000;
            if ((uVar2 >> 9 & 1) == 0) {
              iVar9 = 0;
              do {
                iVar9 = iVar9 + 1;
                uVar10 = uVar8 >> 8;
                uVar8 = uVar8 * 2;
              } while ((uVar10 & 1) == 0);
              uVar10 = iVar9 * -0x800000 + 0x38000000;
            }
            uVar6 = (uVar8 * 2 & 0x3fe) * 0x2000 + (uVar6 << 0x1f | uVar10);
          }
        }
        else {
          uVar6 = uVar8 * 0x2000 + (uVar10 << 0x17 | uVar6 << 0x1f) + 0x38000000;
        }
      }
      *puVar5 = uVar6;
      data = data + 1;
      puVar5 = puVar5 + 1;
      bVar3 = 1 < size;
      size = size + -1;
    } while (bVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_float16(const unsigned short* data, int size)
{
    Mat m(size);
    if (m.empty())
        return m;

    float* ptr = m;//.data;

#if __ARM_NEON && (__ARM_FP & 2)
    int nn = cpu_support_arm_vfpv4() ? size >> 2 : 0;
    int remain = size - (nn << 2);
#else
    int remain = size;
#endif // __ARM_NEON

#if __ARM_NEON && (__ARM_FP & 2)
#if __aarch64__
    if (nn > 0)
    {
    asm volatile(
        "0:                             \n"
        "ld1    {v0.4h}, [%1], #8       \n"
        "fcvtl  v1.4s, v0.4h            \n"
        "subs   %w0, %w0, #1            \n"
        "st1    {v1.4s}, [%2], #16      \n"
        "bne    0b                      \n"
        : "=r"(nn),     // %0
          "=r"(data),   // %1
          "=r"(ptr)     // %2
        : "0"(nn),
          "1"(data),
          "2"(ptr)
        : "cc", "memory", "v0", "v1"
    );
    }
#else
    if (nn > 0)
    {
    asm volatile(
        "0:                             \n"
        "pld        [%1, #64]           \n"
        "vld1.s16   {d0}, [%1 :64]!     \n"
        "vcvt.f32.f16 q1, d0            \n"
        "subs       %0, #1              \n"
        "vst1.f32   {d2-d3}, [%2 :128]! \n"
        "bne        0b                  \n"
        : "=r"(nn),     // %0
          "=r"(data),   // %1
          "=r"(ptr)     // %2
        : "0"(nn),
          "1"(data),
          "2"(ptr)
        : "cc", "memory", "q0", "q1"
    );
    }
#endif // __aarch64__
#endif // __ARM_NEON
    for (; remain>0; remain--)
    {
        *ptr = half2float(*data);

        data++;
        ptr++;
    }

    return m;
}